

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayerBuilder.cpp
# Opt level: O0

ILayer * __thiscall DenseLifLayerBuilder::Build(DenseLifLayerBuilder *this,LayerMeta *meta)

{
  ILayer *this_00;
  LayerMeta local_58;
  LayerMeta *local_18;
  LayerMeta *meta_local;
  DenseLifLayerBuilder *this_local;
  
  local_18 = meta;
  meta_local = (LayerMeta *)this;
  this_00 = (ILayer *)operator_new(0x160);
  LayerMeta::LayerMeta(&local_58,meta);
  DenseLifLayer::DenseLifLayer((DenseLifLayer *)this_00,&local_58);
  LayerMeta::~LayerMeta(&local_58);
  return this_00;
}

Assistant:

ILayer *DenseLifLayerBuilder::Build( LayerMeta meta ) const
{
    return new DenseLifLayer( meta );
}